

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O0

int Fra_ClausRunSat(Clu_Man_t *p)

{
  lit lVar1;
  int iVar2;
  lit *begin;
  Aig_Obj_t *pAVar3;
  int local_2c;
  int RetValue;
  int i;
  int *pLits;
  Aig_Obj_t *pObj;
  Clu_Man_t *p_local;
  
  begin = (lit *)malloc((long)(p->nFrames + 1) << 2);
  pAVar3 = Aig_ManCo(p->pAig,0);
  for (local_2c = 0; local_2c <= p->nFrames; local_2c = local_2c + 1) {
    iVar2 = p->pCnf->nVars;
    lVar1 = toLitCond(p->pCnf->pVarNums[pAVar3->Id],(uint)(local_2c != p->nFrames));
    begin[local_2c] = local_2c * 2 * iVar2 + lVar1;
  }
  iVar2 = sat_solver_solve(p->pSatMain,begin,begin + (long)p->nFrames + 1,(long)p->nBTLimit,0,0,0);
  if (begin != (lit *)0x0) {
    free(begin);
  }
  if (iVar2 == -1) {
    p_local._4_4_ = 1;
  }
  else {
    if (iVar2 != 1) {
      __assert_fail("RetValue == l_True",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraClaus.c"
                    ,0x8a,"int Fra_ClausRunSat(Clu_Man_t *)");
    }
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int Fra_ClausRunSat( Clu_Man_t * p )
{
    Aig_Obj_t * pObj;
    int * pLits;
    int i, RetValue;
    pLits = ABC_ALLOC( int, p->nFrames + 1 );
    // set the output literals
    pObj = Aig_ManCo(p->pAig, 0);
    for ( i = 0; i <= p->nFrames; i++ )
        pLits[i] = i * 2 * p->pCnf->nVars + toLitCond( p->pCnf->pVarNums[pObj->Id], i != p->nFrames ); 
    // try to solve the problem
    RetValue = sat_solver_solve( p->pSatMain, pLits, pLits + p->nFrames + 1, (ABC_INT64_T)p->nBTLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    ABC_FREE( pLits );
    if ( RetValue == l_False )
        return 1;
    // get the counter-example
    assert( RetValue == l_True );
    return 0;
}